

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O3

void anon_unknown.dwarf_2dfa33::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_3_2::Rgba> *p1,RgbaChannels channels
               ,Compression comp)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  float *pfVar7;
  int iVar8;
  long lVar9;
  half *phVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  undefined4 in_register_00000034;
  Array2D<Imf_3_2::Rgba> *src;
  char *pcVar14;
  half *phVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  RgbaOutputFile out;
  Array2D<Imf_3_2::Rgba> p2;
  WriterThread writer1;
  Header header;
  WriterThread writer2;
  Rgba local_130 [8];
  Array2D<Imf_3_2::Rgba> local_f0;
  undefined1 local_d8 [32];
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  Header local_88 [56];
  ReaderThread local_50;
  
  src = (Array2D<Imf_3_2::Rgba> *)CONCAT44(in_register_00000034,width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"channels ",9);
  local_98 = (ulong)(height & 1U);
  pcVar14 = "R";
  if ((height & 1U) == 0) {
    pcVar14 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,local_98);
  uVar12 = height & 2;
  pcVar14 = "G";
  if (uVar12 == 0) {
    pcVar14 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar14,(ulong)(uVar12 >> 1));
  uVar19 = height & 4;
  pcVar14 = "B";
  if (uVar19 == 0) {
    pcVar14 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar14,(ulong)(uVar19 >> 2));
  uVar11 = height & 8;
  pcVar14 = "A";
  if (uVar11 == 0) {
    pcVar14 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar14,(ulong)(uVar11 >> 3));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", compression ",0xe);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)p1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  std::ostream::flush();
  local_130[0].r._h = 0;
  local_130[0].g._h = 0;
  local_130[0].b._h = 0;
  local_130[0].a._h = 0;
  Imf_3_2::Header::Header
            (local_88,0x55b,0x9f,1.0,(Vec2 *)local_130,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar4 = (int *)Imf_3_2::Header::compression();
  *piVar4 = (int)p1;
  remove(fileName);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_130,fileName,local_88,height,iVar2);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_130,(ulong)src->_data,1);
  (anonymous_namespace)::remainingScanlines = 0x9f;
  WriterThread::WriterThread((WriterThread *)local_d8,(RgbaOutputFile *)local_130);
  WriterThread::WriterThread((WriterThread *)&local_50,(RgbaOutputFile *)local_130);
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Thread::~Thread(&local_50.super_Thread);
  IlmThread_3_2::Thread::~Thread((Thread *)local_d8);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_130);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_130,fileName,iVar2);
  piVar4 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar2 = piVar4[2];
  lVar18 = (long)*piVar4;
  local_90 = iVar2 - lVar18;
  lVar9 = local_90 + 1;
  local_a8 = (long)piVar4[3];
  lVar13 = (long)piVar4[1];
  local_a0 = local_a8 - lVar13;
  local_f0._sizeX = local_a0 + 1;
  local_f0._sizeY = lVar9;
  local_f0._data =
       (Rgba *)operator_new__(-(ulong)((ulong)(local_f0._sizeX * lVar9) >> 0x3d != 0) |
                              local_f0._sizeX * lVar9 * 8);
  local_b8 = lVar13;
  local_b0 = lVar18;
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (local_130,(ulong)(local_f0._data + (-lVar13 * lVar9 - lVar18)),1);
  uVar1 = local_98;
  iVar8 = (int)lVar9;
  ReaderThread::ReaderThread((ReaderThread *)local_d8,(RgbaInputFile *)local_130,0,iVar8);
  ReaderThread::ReaderThread(&local_50,(RgbaInputFile *)local_130,1,iVar8);
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Thread::~Thread(&local_50.super_Thread);
  IlmThread_3_2::Thread::~Thread((Thread *)local_d8);
  puVar5 = (undefined8 *)Imf_3_2::RgbaInputFile::displayWindow();
  puVar6 = (undefined8 *)Imf_3_2::Header::displayWindow();
  iVar25 = -(uint)((int)*puVar6 == (int)*puVar5);
  iVar26 = -(uint)((int)((ulong)*puVar6 >> 0x20) == (int)((ulong)*puVar5 >> 0x20));
  auVar21._4_4_ = iVar25;
  auVar21._0_4_ = iVar25;
  auVar21._8_4_ = iVar26;
  auVar21._12_4_ = iVar26;
  iVar8 = movmskpd(iVar8,auVar21);
  if ((iVar8 != 3) ||
     (iVar25 = -(uint)((int)puVar6[1] == (int)puVar5[1]),
     iVar26 = -(uint)((int)((ulong)puVar6[1] >> 0x20) == (int)((ulong)puVar5[1] >> 0x20)),
     auVar22._4_4_ = iVar25, auVar22._0_4_ = iVar25, auVar22._8_4_ = iVar26, auVar22._12_4_ = iVar26
     , iVar25 = movmskpd((int)puVar6,auVar22), iVar25 != 3)) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,199,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  puVar5 = (undefined8 *)Imf_3_2::RgbaInputFile::dataWindow();
  puVar6 = (undefined8 *)Imf_3_2::Header::dataWindow();
  iVar25 = -(uint)((int)*puVar6 == (int)*puVar5);
  iVar26 = -(uint)((int)((ulong)*puVar6 >> 0x20) == (int)((ulong)*puVar5 >> 0x20));
  auVar23._4_4_ = iVar25;
  auVar23._0_4_ = iVar25;
  auVar23._8_4_ = iVar26;
  auVar23._12_4_ = iVar26;
  iVar8 = movmskpd(iVar8,auVar23);
  if ((iVar8 != 3) ||
     (iVar8 = -(uint)((int)puVar6[1] == (int)puVar5[1]),
     iVar25 = -(uint)((int)((ulong)puVar6[1] >> 0x20) == (int)((ulong)puVar5[1] >> 0x20)),
     auVar24._4_4_ = iVar8, auVar24._0_4_ = iVar8, auVar24._8_4_ = iVar25, auVar24._12_4_ = iVar25,
     iVar8 = movmskpd((int)puVar6,auVar24), iVar8 != 3)) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,200,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  fVar20 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
  pfVar7 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar20 == *pfVar7) && (!NAN(fVar20) && !NAN(*pfVar7))) {
    Imf_3_2::RgbaInputFile::screenWindowCenter();
    pfVar7 = (float *)Imf_3_2::Header::screenWindowCenter();
    if (((((float)local_d8._0_4_ != *pfVar7) || (NAN((float)local_d8._0_4_) || NAN(*pfVar7))) ||
        ((float)local_d8._4_4_ != pfVar7[1])) || (NAN((float)local_d8._4_4_) || NAN(pfVar7[1]))) {
      __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                    ,0xca,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                   );
    }
    fVar20 = (float)Imf_3_2::RgbaInputFile::screenWindowWidth();
    pfVar7 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar20 != *pfVar7) || (NAN(fVar20) || NAN(*pfVar7))) {
      __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                    ,0xcb,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                   );
    }
    iVar8 = Imf_3_2::RgbaInputFile::lineOrder();
    piVar4 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar8 != *piVar4) {
      __assert_fail("in.lineOrder () == header.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                    ,0xcc,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                   );
    }
    iVar8 = Imf_3_2::RgbaInputFile::compression();
    piVar4 = (int *)Imf_3_2::Header::compression();
    if (iVar8 == *piVar4) {
      iVar8 = Imf_3_2::RgbaInputFile::channels();
      if (iVar8 != height) {
        __assert_fail("in.channels () == channels",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                      ,0xce,
                      "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                     );
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing ",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      iVar8 = Imf_3_2::RgbaInputFile::compression();
      if ((iVar8 == 6) || (iVar8 = Imf_3_2::RgbaInputFile::compression(), iVar8 == 7)) {
        compareB44(0x55b,0x9f,src,&local_f0,height);
      }
      else {
        iVar8 = Imf_3_2::RgbaInputFile::compression();
        if ((iVar8 == 8) || (iVar8 = Imf_3_2::RgbaInputFile::compression(), iVar8 == 9)) {
          compareDwa(0x55b,0x9f,src,&local_f0,height);
        }
        else if (-1 < (int)local_a0) {
          phVar10 = &(local_f0._data)->a;
          phVar15 = &src->_data->a;
          uVar16 = 0;
          do {
            if (-1 < (int)local_90) {
              uVar17 = 0;
              do {
                fVar20 = *(float *)(_imath_half_to_float_table +
                                   (ulong)phVar10[uVar17 * 4 + -3]._h * 4);
                if ((int)uVar1 == 0) {
                  if ((fVar20 != 0.0) || (NAN(fVar20))) {
                    __assert_fail("p2[y][x].r == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xe6,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                else {
                  pfVar7 = (float *)(_imath_half_to_float_table +
                                    (ulong)phVar15[uVar17 * 4 + -3]._h * 4);
                  if ((fVar20 != *pfVar7) || (NAN(fVar20) || NAN(*pfVar7))) {
                    __assert_fail("p2[y][x].r == p1[y][x].r",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xe4,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                fVar20 = *(float *)(_imath_half_to_float_table +
                                   (ulong)phVar10[uVar17 * 4 + -2]._h * 4);
                if (uVar12 == 0) {
                  if ((fVar20 != 0.0) || (NAN(fVar20))) {
                    __assert_fail("p2[y][x].g == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xeb,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                else {
                  pfVar7 = (float *)(_imath_half_to_float_table +
                                    (ulong)phVar15[uVar17 * 4 + -2]._h * 4);
                  if ((fVar20 != *pfVar7) || (NAN(fVar20) || NAN(*pfVar7))) {
                    __assert_fail("p2[y][x].g == p1[y][x].g",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xe9,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                fVar20 = *(float *)(_imath_half_to_float_table +
                                   (ulong)phVar10[uVar17 * 4 + -1]._h * 4);
                if (uVar19 == 0) {
                  if ((fVar20 != 0.0) || (NAN(fVar20))) {
                    __assert_fail("p2[y][x].b == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xf0,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                else {
                  pfVar7 = (float *)(_imath_half_to_float_table +
                                    (ulong)phVar15[uVar17 * 4 + -1]._h * 4);
                  if ((fVar20 != *pfVar7) || (NAN(fVar20) || NAN(*pfVar7))) {
                    __assert_fail("p2[y][x].b == p1[y][x].b",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xee,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                fVar20 = *(float *)(_imath_half_to_float_table + (ulong)phVar10[uVar17 * 4]._h * 4);
                if (uVar11 == 0) {
                  if ((fVar20 != 1.0) || (NAN(fVar20))) {
                    __assert_fail("p2[y][x].a == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xf5,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                else {
                  pfVar7 = (float *)(_imath_half_to_float_table + (ulong)phVar15[uVar17 * 4]._h * 4)
                  ;
                  if ((fVar20 != *pfVar7) || (NAN(fVar20) || NAN(*pfVar7))) {
                    __assert_fail("p2[y][x].a == p1[y][x].a",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                                  ,0xf3,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                                 );
                  }
                }
                uVar17 = uVar17 + 1;
              } while ((iVar2 - (int)local_b0) + 1 != uVar17);
            }
            uVar16 = uVar16 + 1;
            phVar10 = phVar10 + local_f0._sizeY * 4;
            phVar15 = phVar15 + src->_sizeY * 4;
          } while (uVar16 != ((int)local_a8 - (int)local_b8) + 1);
        }
      }
      if (local_f0._data != (Rgba *)0x0) {
        operator_delete__(local_f0._data);
      }
      Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_130);
      remove(fileName);
      Imf_3_2::Header::~Header(local_88);
      return;
    }
    __assert_fail("in.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,0xcd,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                ,0xc9,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
               );
}

Assistant:

void
writeReadRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    RgbaChannels         channels,
    Compression          comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & WRITE_R) ? "R" : "")
         << ((channels & WRITE_G) ? "G" : "")
         << ((channels & WRITE_B) ? "B" : "")
         << ((channels & WRITE_A) ? "A" : "") << ", compression " << comp
         << ", " << flush;

    Header header (width, height);
    header.compression () = comp;

    {
        remove (fileName);
        cout << "writing " << flush;
        RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);

        remainingScanlines = height;
        WriterThread writer1 (&out);
        WriterThread writer2 (&out);
        threadSemaphore.wait ();
        threadSemaphore.wait ();
    }

    {
        cout << "reading " << flush;
        RgbaInputFile in (fileName);
        const Box2i&  dw = in.dataWindow ();

        int w  = dw.max.x - dw.min.x + 1;
        int h  = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);

        {
            ReaderThread reader1 (&in, 0, 2);
            ReaderThread reader2 (&in, 1, 2);
            threadSemaphore.wait ();
            threadSemaphore.wait ();
        }

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        cout << "comparing " << endl;

        if (in.compression () == B44_COMPRESSION ||
            in.compression () == B44A_COMPRESSION)
        {
            compareB44 (width, height, p1, p2, channels);
        }
        else if (
            in.compression () == DWAA_COMPRESSION ||
            in.compression () == DWAB_COMPRESSION)
        {
            compareDwa (width, height, p1, p2, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    if (channels & WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (p2[y][x].r == 0);

                    if (channels & WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (p2[y][x].g == 0);

                    if (channels & WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (p2[y][x].b == 0);

                    if (channels & WRITE_A)
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (p2[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName);
}